

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

parameter * __thiscall
clipp::option<char_const(&)[3],char_const(&)[8]>
          (parameter *__return_storage_ptr__,clipp *this,char (*flag) [3],char (*flags) [8])

{
  allocator<char> local_139;
  arg_string local_138;
  parameter local_118;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,(char *)this,&local_139);
  parameter::parameter<char_const(&)[8]>(&local_118,&local_138,(char (*) [8])flag);
  local_118.required_ = false;
  local_118.super_token<clipp::parameter>.repeatable_ = false;
  local_118.super_token<clipp::parameter>.blocking_ = false;
  parameter::parameter(__return_storage_ptr__,&local_118);
  parameter::~parameter(&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

inline parameter
option(String&& flag, Strings&&... flags)
{
    return parameter{std::forward<String>(flag), std::forward<Strings>(flags)...}
        .required(false).blocking(false).repeatable(false);
}